

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitArrayNew
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,ArrayNew *curr)

{
  bool bVar1;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar2;
  Literal *pLVar3;
  undefined8 uVar4;
  Literals local_238;
  undefined1 local_200 [4];
  Index i_1;
  undefined1 local_1e8 [8];
  Literal value;
  Field aFStack_1b8 [8];
  Field field;
  Literal local_198;
  uint local_17c;
  undefined1 local_178 [4];
  Index i;
  Literals data;
  undefined1 auStack_138 [4];
  Index num;
  undefined1 *local_128;
  Field *element;
  HeapType heapType;
  undefined1 local_110 [8];
  Flow size;
  Flow local_c0;
  undefined1 local_68 [8];
  Flow init;
  ArrayNew *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  Flow *init_1;
  
  init.breakTo.super_IString.str._M_str = (char *)curr;
  Flow::Flow((Flow *)local_68);
  bVar1 = ArrayNew::isWithDefault((ArrayNew *)init.breakTo.super_IString.str._M_str);
  if (!bVar1) {
    pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    visit(&local_c0,pEVar2,*(Expression **)(init.breakTo.super_IString.str._M_str + 0x10));
    Flow::operator=((Flow *)local_68,&local_c0);
    Flow::~Flow(&local_c0);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      size.breakTo.super_IString.str._M_str._4_4_ = 1;
      goto LAB_0018d3dc;
    }
  }
  pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  visit((Flow *)local_110,pEVar2,*(Expression **)(init.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_110);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_110);
    size.breakTo.super_IString.str._M_str._4_4_ = 1;
  }
  else {
    heapType.id._4_4_ = 1;
    bVar1 = Type::operator==((Type *)(init.breakTo.super_IString.str._M_str + 8),
                             (BasicType *)((long)&heapType.id + 4));
    if (bVar1) {
      heapType.id._3_1_ = 0;
      pEVar2 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
      visit(__return_storage_ptr__,pEVar2,
            *(Expression **)(init.breakTo.super_IString.str._M_str + 0x10));
      bVar1 = Flow::breaking(__return_storage_ptr__);
      if (!bVar1) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x64e,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitArrayNew(ArrayNew *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
      size.breakTo.super_IString.str._M_str._4_4_ = 1;
      heapType.id._3_1_ = 1;
    }
    else {
      element = (Field *)::wasm::Type::getHeapType();
      ::wasm::HeapType::getArray();
      local_128 = auStack_138;
      pLVar3 = Flow::getSingleValue((Flow *)local_110);
      data.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = wasm::Literal::geti32(pLVar3);
      if (0x2aaaaa9 <
          data.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
      }
      Literals::Literals((Literals *)local_178,
                         (ulong)data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      bVar1 = ArrayNew::isWithDefault((ArrayNew *)init.breakTo.super_IString.str._M_str);
      if (bVar1) {
        for (local_17c = 0;
            local_17c <
            data.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_; local_17c = local_17c + 1) {
          ::wasm::Literal::makeZero((Type)&local_198);
          pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)local_178,(ulong)local_17c);
          ::wasm::Literal::operator=(pLVar3,&local_198);
          ::wasm::Literal::~Literal(&local_198);
        }
      }
      else {
        value.type.id = ::wasm::Type::getHeapType();
        ::wasm::HeapType::getArray();
        pLVar3 = Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::Literal((Literal *)local_200,pLVar3);
        truncateForPacking((Literal *)local_1e8,this,(Literal *)local_200,aFStack_1b8);
        ::wasm::Literal::~Literal((Literal *)local_200);
        for (local_238.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            local_238.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ <
            data.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
            local_238.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 local_238.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)local_178,
                              (ulong)local_238.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          ::wasm::Literal::operator=(pLVar3,(Literal *)local_1e8);
        }
        ::wasm::Literal::~Literal((Literal *)local_1e8);
      }
      local_238.super_SmallVector<wasm::Literal,_1UL>.usedFixed = ::wasm::Type::getHeapType();
      std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals&>
                ((HeapType *)&local_238.super_SmallVector<wasm::Literal,_1UL>.fixed,&local_238);
      uVar4 = ::wasm::Type::getHeapType();
      ::wasm::Literal::Literal
                ((Literal *)&local_238.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
                 &local_238.super_SmallVector<wasm::Literal,_1UL>.fixed,uVar4);
      Flow::Flow(__return_storage_ptr__,
                 (Literal *)&local_238.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type)
      ;
      ::wasm::Literal::~Literal
                ((Literal *)&local_238.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type)
      ;
      std::shared_ptr<wasm::GCData>::~shared_ptr
                ((shared_ptr<wasm::GCData> *)&local_238.super_SmallVector<wasm::Literal,_1UL>.fixed)
      ;
      size.breakTo.super_IString.str._M_str._4_4_ = 1;
      Literals::~Literals((Literals *)local_178);
    }
  }
  Flow::~Flow((Flow *)local_110);
LAB_0018d3dc:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNew(ArrayNew* curr) {
    NOTE_ENTER("ArrayNew");
    Flow init;
    if (!curr->isWithDefault()) {
      init = self()->visit(curr->init);
      if (init.breaking()) {
        return init;
      }
    }
    auto size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // visit the unreachable child, and stop there.
      auto init = self()->visit(curr->init);
      assert(init.breaking());
      return init;
    }
    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Index num = size.getSingleValue().geti32();
    if (num >= ArrayLimit) {
      hostLimit("allocation failure");
    }
    Literals data(num);
    if (curr->isWithDefault()) {
      for (Index i = 0; i < num; i++) {
        data[i] = Literal::makeZero(element.type);
      }
    } else {
      auto field = curr->type.getHeapType().getArray().element;
      auto value = truncateForPacking(init.getSingleValue(), field);
      for (Index i = 0; i < num; i++) {
        data[i] = value;
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }